

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O3

void printFPImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  byte bVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  MCOperand *op;
  int64_t iVar5;
  uint8_t *puVar6;
  uint8_t uVar7;
  undefined4 in_register_00000034;
  double dVar8;
  
  op = MCInst_getOperand(MI,1);
  _Var3 = MCOperand_isFPImm(op);
  if (_Var3) {
    dVar8 = MCOperand_getFPImm(op);
  }
  else {
    iVar5 = MCOperand_getImm(op);
    uVar4 = (uint)iVar5;
    dVar8 = (double)(float)(((uVar4 & 0x3f) << 0x13 | (uVar4 & 0xffffffc0) << 0x18 |
                            (int)(uVar4 << 0x19) >> 0x1f & 0x3e000000U) ^ 0x40000000);
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),"#%.8f");
  h = MI->csh;
  if (h->detail != CS_OPT_OFF) {
    uVar4 = MCInst_getOpcode(MI);
    bVar1 = MI->ac_idx;
    puVar6 = AArch64_get_op_access(h,uVar4);
    uVar7 = '\0';
    if (puVar6[bVar1] != 0x80) {
      uVar7 = puVar6[bVar1];
    }
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = uVar7;
    MI->ac_idx = MI->ac_idx + '\x01';
    pcVar2 = MI->flat_insn->detail;
    puVar6 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
    puVar6[0] = '\x04';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(double *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) = dVar8;
    puVar6 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
    *puVar6 = *puVar6 + '\x01';
  }
  return;
}

Assistant:

static void printFPImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	double FPImm = MCOperand_isFPImm(MO) ? MCOperand_getFPImm(MO) : AArch64_AM_getFPImmFloat((int)MCOperand_getImm(MO));

	// 8 decimal places are enough to perfectly represent permitted floats.
#if defined(_KERNEL_MODE)
	// Issue #681: Windows kernel does not support formatting float point
	SStream_concat(O, "#<float_point_unsupported>");
#else
	SStream_concat(O, "#%.8f", FPImm);
#endif
	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access;
		access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
		MI->ac_idx++;
#endif
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_FP;
		MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].fp = FPImm;
		MI->flat_insn->detail->arm64.op_count++;
	}
}